

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::StateReplayer::Impl::forget_pipeline_handle_references(Impl *this)

{
  Impl *this_local;
  
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->replayed_compute_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->replayed_graphics_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->replayed_raytracing_pipelines);
  return;
}

Assistant:

void StateReplayer::Impl::forget_pipeline_handle_references()
{
	replayed_compute_pipelines.clear();
	replayed_graphics_pipelines.clear();
	replayed_raytracing_pipelines.clear();
}